

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

const_reference __thiscall
immutable::vector<int,_false,_6>::operator[](vector<int,_false,_6> *this,size_type_conflict index)

{
  int *piVar1;
  size_type_conflict index_local;
  vector<int,_false,_6> *this_local;
  
  piVar1 = rrb_nth<int,false,6>(&this->_impl,index);
  return piVar1;
}

Assistant:

const_reference operator [] (size_type index) const
        {
        return rrb_nth(_impl, index);
        }